

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmtp_engine.cpp
# Opt level: O0

void __thiscall
zmq::zmtp_engine_t::zmtp_engine_t
          (zmtp_engine_t *this,fd_t fd_,options_t *options_,endpoint_uri_pair_t *endpoint_uri_pair_)

{
  int iVar1;
  int *piVar2;
  char *pcVar3;
  options_t *in_RCX;
  undefined8 in_RDX;
  uint in_ESI;
  EVP_PKEY_CTX *ctx;
  undefined8 *in_RDI;
  char *errstr_1;
  char *errstr;
  int rc;
  bool in_stack_ffffffffffffffd7;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  undefined4 in_stack_fffffffffffffff0;
  
  ctx = (EVP_PKEY_CTX *)(ulong)in_ESI;
  stream_engine_base_t::stream_engine_base_t
            ((stream_engine_base_t *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
             (fd_t)((ulong)in_RDX >> 0x20),in_RCX,
             (endpoint_uri_pair_t *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
             in_stack_ffffffffffffffd7);
  *in_RDI = &PTR__zmtp_engine_t_003eaa18;
  in_RDI[2] = &DAT_003eaad8;
  in_RDI[0xdc] = 0xc;
  *(undefined4 *)(in_RDI + 0xed) = 0;
  *(undefined1 *)((long)in_RDI + 0x76c) = 0;
  *(undefined4 *)(in_RDI + 0xee) = 0;
  in_RDI[0xa9] = routing_id_msg;
  in_RDI[0xaa] = 0;
  in_RDI[0xab] = process_routing_id_msg;
  in_RDI[0xac] = 0;
  iVar1 = msg_t::init((msg_t *)(in_RDI + 0xd4),ctx);
  if (iVar1 != 0) {
    piVar2 = __errno_location();
    pcVar3 = strerror(*piVar2);
    ctx = (EVP_PKEY_CTX *)0x32b5b5;
    fprintf(_stderr,"%s (%s:%d)\n",pcVar3,
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/zmtp_engine.cpp"
            ,0x52);
    fflush(_stderr);
    zmq_abort((char *)0x310839);
  }
  iVar1 = msg_t::init((msg_t *)(in_RDI + 0xcc),ctx);
  if (iVar1 != 0) {
    piVar2 = __errno_location();
    pcVar3 = strerror(*piVar2);
    fprintf(_stderr,"%s (%s:%d)\n",pcVar3,
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/zmtp_engine.cpp"
            ,0x55);
    fflush(_stderr);
    zmq_abort((char *)0x3108e6);
  }
  if ((0 < *(int *)((long)in_RDI + 0x3cc)) &&
     (*(undefined4 *)(in_RDI + 0xee) = *(undefined4 *)(in_RDI + 0x7a), *(int *)(in_RDI + 0xee) == -1
     )) {
    *(undefined4 *)(in_RDI + 0xee) = *(undefined4 *)((long)in_RDI + 0x3cc);
  }
  return;
}

Assistant:

zmq::zmtp_engine_t::zmtp_engine_t (
  fd_t fd_,
  const options_t &options_,
  const endpoint_uri_pair_t &endpoint_uri_pair_) :
    stream_engine_base_t (fd_, options_, endpoint_uri_pair_, true),
    _greeting_size (v2_greeting_size),
    _greeting_bytes_read (0),
    _subscription_required (false),
    _heartbeat_timeout (0)
{
    _next_msg = static_cast<int (stream_engine_base_t::*) (msg_t *)> (
      &zmtp_engine_t::routing_id_msg);
    _process_msg = static_cast<int (stream_engine_base_t::*) (msg_t *)> (
      &zmtp_engine_t::process_routing_id_msg);

    int rc = _pong_msg.init ();
    errno_assert (rc == 0);

    rc = _routing_id_msg.init ();
    errno_assert (rc == 0);

    if (_options.heartbeat_interval > 0) {
        _heartbeat_timeout = _options.heartbeat_timeout;
        if (_heartbeat_timeout == -1)
            _heartbeat_timeout = _options.heartbeat_interval;
    }
}